

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QStyle::SubControl,_QRect> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_>::findNode<QStyle::SubControl>
          (Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_> *this,SubControl *key)

{
  ulong uVar1;
  Node<QStyle::SubControl,_QRect> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QStyle::SubControl>(this,key);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<QStyle::SubControl,_QRect> *)0x0;
  }
  else {
    pNVar2 = (Node<QStyle::SubControl,_QRect> *)((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }